

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerMSL::emit_store_statement
          (CompilerMSL *this,uint32_t lhs_expression,uint32_t rhs_expression)

{
  bool bVar1;
  char cVar2;
  byte bVar3;
  bool bVar4;
  uint32_t id;
  uint uVar5;
  SPIRType *pSVar6;
  undefined7 extraout_var;
  SPIRExpression *pSVar7;
  SPIRExpression *pSVar8;
  SPIRType *pSVar9;
  string *psVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  CompilerError *this_00;
  undefined4 uVar12;
  ulong uVar13;
  char *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  char (*pacVar14) [2];
  uint local_378;
  uint local_374;
  SPIRExpression *local_370;
  undefined4 local_364;
  string rhs_row;
  string unpacked_expr;
  char *packed_pfx;
  string cast_expr;
  string local_2f0;
  SPIRType vector_type;
  SPIRType write_type;
  
  pSVar6 = Compiler::expression_type((Compiler *)this,rhs_expression);
  bVar1 = Compiler::has_extended_decoration
                    ((Compiler *)this,lhs_expression,SPIRVCrossDecorationPhysicalTypeID);
  uVar13 = CONCAT71(extraout_var,bVar1) & 0xffffffff;
  bVar1 = Compiler::has_extended_decoration
                    ((Compiler *)this,lhs_expression,SPIRVCrossDecorationPhysicalTypePacked);
  pSVar7 = Compiler::maybe_get<spirv_cross::SPIRExpression>((Compiler *)this,lhs_expression);
  pSVar8 = Compiler::maybe_get<spirv_cross::SPIRExpression>((Compiler *)this,rhs_expression);
  if (pSVar7 == (SPIRExpression *)0x0) {
    bVar3 = 0;
  }
  else {
    bVar3 = pSVar7->need_transpose;
  }
  cVar2 = (char)uVar13;
  local_370 = pSVar7;
  if (cVar2 != '\0' || bVar1) {
    if (cVar2 == '\0') {
      bVar4 = Compiler::is_matrix((Compiler *)this,pSVar6);
      if (!bVar4 && (bVar3 & 1) == 0) goto LAB_00296de0;
      id = (pSVar6->super_IVariant).self.id;
    }
    else {
      id = Compiler::get_extended_decoration
                     ((Compiler *)this,lhs_expression,SPIRVCrossDecorationPhysicalTypeID);
    }
    pSVar9 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,id);
    bVar4 = Compiler::is_matrix((Compiler *)this,pSVar6);
    if (bVar4) {
      packed_pfx = "";
      if (bVar1) {
        packed_pfx = "packed_";
      }
      if (pSVar8 == (SPIRExpression *)0x0) {
        uVar12 = 0;
      }
      else {
        uVar12 = (undefined4)CONCAT71((int7)(uVar13 >> 8),pSVar8->need_transpose);
      }
      SPIRType::SPIRType(&write_type,pSVar6);
      cast_expr._M_dataplus._M_p = (pointer)&cast_expr.field_2;
      cast_expr._M_string_length = 0;
      cast_expr.field_2._M_local_buf[0] = '\0';
      if ((char)uVar12 != '\0') {
        pSVar8->need_transpose = false;
      }
      local_364 = uVar12;
      if (bVar3 == 0) {
        write_type.columns = 1;
        if (pSVar9->vecsize != pSVar6->vecsize) {
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (&rhs_row,this,&write_type,0);
          join<char_const(&)[9],char_const*&,std::__cxx11::string,char_const(&)[3]>
                    ((string *)&vector_type,(spirv_cross *)0x314730,(char (*) [9])&packed_pfx,
                     (char **)&rhs_row,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x30a7cf,
                     (char (*) [3])in_R9);
          ::std::__cxx11::string::operator=((string *)&cast_expr,(string *)&vector_type);
          ::std::__cxx11::string::~string((string *)&vector_type);
          ::std::__cxx11::string::~string((string *)&rhs_row);
        }
        if ((char)local_364 == '\0') {
          for (unpacked_expr._M_dataplus._M_p._0_4_ = 0;
              (uint)unpacked_expr._M_dataplus._M_p < pSVar6->columns;
              unpacked_expr._M_dataplus._M_p._0_4_ = (uint)unpacked_expr._M_dataplus._M_p + 1) {
            CompilerGLSL::to_enclosed_expression_abi_cxx11_
                      ((string *)&vector_type,&this->super_CompilerGLSL,lhs_expression,true);
            CompilerGLSL::to_enclosed_unpacked_expression_abi_cxx11_
                      (&rhs_row,&this->super_CompilerGLSL,rhs_expression,true);
            CompilerGLSL::
            statement<std::__cxx11::string&,std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[2],char_const(&)[4],std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[3]>
                      (&this->super_CompilerGLSL,&cast_expr,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &vector_type,(char (*) [2])0x31c69e,(uint *)&unpacked_expr,
                       (char (*) [2])0x30e88f,(char (*) [4])0x31e8c7,&rhs_row,(char (*) [2])0x31c69e
                       ,(uint *)&unpacked_expr,(char (*) [3])0x30d44b);
            ::std::__cxx11::string::~string((string *)&rhs_row);
            ::std::__cxx11::string::~string((string *)&vector_type);
          }
        }
        else {
          pSVar9 = Compiler::expression_type((Compiler *)this,rhs_expression);
          SPIRType::SPIRType(&vector_type,pSVar9);
          vector_type.columns = 1;
          for (local_374 = 0; local_374 < pSVar6->columns; local_374 = local_374 + 1) {
            CompilerGLSL::type_to_glsl_constructor_abi_cxx11_
                      (&unpacked_expr,&this->super_CompilerGLSL,&vector_type);
            ::std::operator+(&rhs_row,&unpacked_expr,"(");
            ::std::__cxx11::string::~string((string *)&unpacked_expr);
            for (local_378 = 0; local_378 < vector_type.vecsize; local_378 = local_378 + 1) {
              pacVar14 = (char (*) [2])0x29724e;
              CompilerGLSL::to_unpacked_row_major_matrix_expression_abi_cxx11_
                        (&unpacked_expr,&this->super_CompilerGLSL,rhs_expression);
              join<std::__cxx11::string&,char_const(&)[2],unsigned_int&,char_const(&)[3],unsigned_int&,char_const(&)[2]>
                        (&local_2f0,(spirv_cross *)&unpacked_expr,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x31c69e,(char (*) [2])&local_378,(uint *)"][",(char (*) [3])&local_374,
                         (uint *)0x30e88f,pacVar14);
              ::std::__cxx11::string::append((string *)&rhs_row);
              ::std::__cxx11::string::~string((string *)&local_2f0);
              if (local_378 + 1 < vector_type.vecsize) {
                ::std::__cxx11::string::append((char *)&rhs_row);
              }
              ::std::__cxx11::string::~string((string *)&unpacked_expr);
            }
            ::std::__cxx11::string::append((char *)&rhs_row);
            CompilerGLSL::to_enclosed_expression_abi_cxx11_
                      (&unpacked_expr,&this->super_CompilerGLSL,lhs_expression,true);
            CompilerGLSL::
            statement<std::__cxx11::string&,std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[2],char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
                      (&this->super_CompilerGLSL,&cast_expr,&unpacked_expr,(char (*) [2])0x31c69e,
                       &local_374,(char (*) [2])0x30e88f,(char (*) [4])0x31e8c7,&rhs_row,
                       (char (*) [2])0x304bae);
            ::std::__cxx11::string::~string((string *)&unpacked_expr);
            ::std::__cxx11::string::~string((string *)&rhs_row);
          }
          SPIRType::~SPIRType(&vector_type);
        }
      }
      else {
        local_370->need_transpose = false;
        write_type.columns = 1;
        write_type.vecsize = pSVar6->columns;
        if (pSVar9->columns != pSVar6->columns) {
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (&rhs_row,this,&write_type,0);
          join<char_const(&)[9],char_const*&,std::__cxx11::string,char_const(&)[3]>
                    ((string *)&vector_type,(spirv_cross *)0x314730,(char (*) [9])&packed_pfx,
                     (char **)&rhs_row,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x30a7cf,
                     (char (*) [3])in_R9);
          ::std::__cxx11::string::operator=((string *)&cast_expr,(string *)&vector_type);
          ::std::__cxx11::string::~string((string *)&vector_type);
          ::std::__cxx11::string::~string((string *)&rhs_row);
        }
        if ((char)local_364 == '\0') {
          pSVar9 = Compiler::expression_type((Compiler *)this,rhs_expression);
          SPIRType::SPIRType(&vector_type,pSVar9);
          vector_type.vecsize = vector_type.columns;
          vector_type.columns = 1;
          for (local_374 = 0; local_374 < pSVar6->vecsize; local_374 = local_374 + 1) {
            CompilerGLSL::type_to_glsl_constructor_abi_cxx11_
                      (&unpacked_expr,&this->super_CompilerGLSL,&vector_type);
            ::std::operator+(&rhs_row,&unpacked_expr,"(");
            ::std::__cxx11::string::~string((string *)&unpacked_expr);
            uVar5 = 0;
            while (local_378 = uVar5, uVar5 < vector_type.vecsize) {
              pacVar14 = (char (*) [2])0x29751d;
              CompilerGLSL::to_enclosed_unpacked_expression_abi_cxx11_
                        (&local_2f0,&this->super_CompilerGLSL,rhs_expression,true);
              join<std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[3],unsigned_int&,char_const(&)[2]>
                        (&unpacked_expr,(spirv_cross *)&local_2f0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x31c69e,(char (*) [2])&local_378,(uint *)"][",(char (*) [3])&local_374,
                         (uint *)0x30e88f,pacVar14);
              ::std::__cxx11::string::append((string *)&rhs_row);
              ::std::__cxx11::string::~string((string *)&unpacked_expr);
              ::std::__cxx11::string::~string((string *)&local_2f0);
              uVar5 = local_378 + 1;
              if (uVar5 < vector_type.vecsize) {
                ::std::__cxx11::string::append((char *)&rhs_row);
                uVar5 = local_378 + 1;
              }
            }
            ::std::__cxx11::string::append((char *)&rhs_row);
            CompilerGLSL::to_enclosed_expression_abi_cxx11_
                      (&unpacked_expr,&this->super_CompilerGLSL,lhs_expression,true);
            CompilerGLSL::
            statement<std::__cxx11::string&,std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[2],char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
                      (&this->super_CompilerGLSL,&cast_expr,&unpacked_expr,(char (*) [2])0x31c69e,
                       &local_374,(char (*) [2])0x30e88f,(char (*) [4])0x31e8c7,&rhs_row,
                       (char (*) [2])0x304bae);
            ::std::__cxx11::string::~string((string *)&unpacked_expr);
            ::std::__cxx11::string::~string((string *)&rhs_row);
          }
          SPIRType::~SPIRType(&vector_type);
        }
        else {
          for (unpacked_expr._M_dataplus._M_p._0_4_ = 0;
              (uint)unpacked_expr._M_dataplus._M_p < pSVar6->vecsize;
              unpacked_expr._M_dataplus._M_p._0_4_ = (uint)unpacked_expr._M_dataplus._M_p + 1) {
            CompilerGLSL::to_enclosed_expression_abi_cxx11_
                      ((string *)&vector_type,&this->super_CompilerGLSL,lhs_expression,true);
            CompilerGLSL::to_unpacked_row_major_matrix_expression_abi_cxx11_
                      (&rhs_row,&this->super_CompilerGLSL,rhs_expression);
            CompilerGLSL::
            statement<std::__cxx11::string&,std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[2],char_const(&)[4],std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[3]>
                      (&this->super_CompilerGLSL,&cast_expr,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &vector_type,(char (*) [2])0x31c69e,(uint *)&unpacked_expr,
                       (char (*) [2])0x30e88f,(char (*) [4])0x31e8c7,&rhs_row,(char (*) [2])0x31c69e
                       ,(uint *)&unpacked_expr,(char (*) [3])0x30d44b);
            ::std::__cxx11::string::~string((string *)&rhs_row);
            ::std::__cxx11::string::~string((string *)&vector_type);
          }
        }
        local_370->need_transpose = true;
      }
      if ((char)local_364 != '\0') {
        pSVar8->need_transpose = true;
      }
      ::std::__cxx11::string::~string((string *)&cast_expr);
      SPIRType::~SPIRType(&write_type);
    }
    else if (bVar3 == 0) {
      bVar4 = Compiler::is_matrix((Compiler *)this,pSVar9);
      if (((bVar4) || (bVar4 = Compiler::is_array((Compiler *)this,pSVar9), bVar4)) &&
         (pSVar6->vecsize < pSVar9->vecsize)) {
        if (2 < pSVar6->vecsize - 1) {
          __assert_fail("type.vecsize >= 1 && type.vecsize <= 3",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_msl.cpp"
                        ,0xebd,
                        "virtual void spirv_cross::CompilerMSL::emit_store_statement(uint32_t, uint32_t)"
                       );
        }
        if (bVar1) {
          __assert_fail("!lhs_packed_type",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_msl.cpp"
                        ,0xec3,
                        "virtual void spirv_cross::CompilerMSL::emit_store_statement(uint32_t, uint32_t)"
                       );
        }
        CompilerGLSL::to_dereferenced_expression_abi_cxx11_
                  ((string *)&write_type,&this->super_CompilerGLSL,lhs_expression,true);
        CompilerGLSL::to_pointer_expression_abi_cxx11_
                  ((string *)&vector_type,&this->super_CompilerGLSL,rhs_expression,true);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&rhs_row,this,pSVar6,0);
        CompilerGLSL::enclose_expression
                  (&unpacked_expr,&this->super_CompilerGLSL,(string *)&write_type);
        join<char_const(&)[9],std::__cxx11::string,char_const(&)[3],std::__cxx11::string>
                  (&cast_expr,(spirv_cross *)0x314730,(char (*) [9])&rhs_row,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x30a7cf,
                   (char (*) [3])&unpacked_expr,in_R9);
        ::std::__cxx11::string::operator=((string *)&write_type,(string *)&cast_expr);
        ::std::__cxx11::string::~string((string *)&cast_expr);
        ::std::__cxx11::string::~string((string *)&unpacked_expr);
        ::std::__cxx11::string::~string((string *)&rhs_row);
        pSVar6 = Compiler::expression_type((Compiler *)this,rhs_expression);
        bVar1 = CompilerGLSL::optimize_read_modify_write
                          (&this->super_CompilerGLSL,pSVar6,(string *)&write_type,
                           (string *)&vector_type);
        if (!bVar1) {
          CompilerGLSL::
          statement<std::__cxx11::string&,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
                    (&this->super_CompilerGLSL,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &write_type,(char (*) [4])0x31e8c7,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &vector_type,(char (*) [2])0x304bae);
        }
      }
      else {
        bVar1 = Compiler::is_matrix((Compiler *)this,pSVar6);
        if (bVar1) goto LAB_00297709;
        CompilerGLSL::to_dereferenced_expression_abi_cxx11_
                  ((string *)&write_type,&this->super_CompilerGLSL,lhs_expression,true);
        CompilerGLSL::to_pointer_expression_abi_cxx11_
                  ((string *)&vector_type,&this->super_CompilerGLSL,rhs_expression,true);
        pSVar6 = Compiler::expression_type((Compiler *)this,rhs_expression);
        bVar1 = CompilerGLSL::optimize_read_modify_write
                          (&this->super_CompilerGLSL,pSVar6,(string *)&write_type,
                           (string *)&vector_type);
        if (!bVar1) {
          CompilerGLSL::
          statement<std::__cxx11::string&,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
                    (&this->super_CompilerGLSL,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &write_type,(char (*) [4])0x31e8c7,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &vector_type,(char (*) [2])0x304bae);
        }
      }
      ::std::__cxx11::string::~string((string *)&vector_type);
      ::std::__cxx11::string::~string((string *)&write_type);
    }
    else {
      local_370->need_transpose = false;
      SPIRType::SPIRType(&write_type,pSVar6);
      write_type.vecsize = 1;
      write_type.columns = 1;
      for (local_2f0._M_dataplus._M_p._0_4_ = 0; (uint)local_2f0._M_dataplus._M_p < pSVar6->vecsize;
          local_2f0._M_dataplus._M_p._0_4_ = (uint)local_2f0._M_dataplus._M_p + 1) {
        CompilerGLSL::to_enclosed_expression_abi_cxx11_
                  ((string *)&vector_type,&this->super_CompilerGLSL,lhs_expression,true);
        psVar10 = (string *)::std::__cxx11::string::rfind((char)&vector_type,0x5b);
        if (psVar10 != (string *)0xffffffffffffffff) {
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (&cast_expr,this,&write_type,0);
          packed_pfx = (char *)CONCAT71(packed_pfx._1_7_,0x5b);
          local_374 = CONCAT31(local_374._1_3_,0x5d);
          join<char,unsigned_int&,char,char_const(&)[2]>
                    (&rhs_row,(spirv_cross *)&packed_pfx,(char *)&local_2f0,&local_374,")",
                     (char (*) [2])in_R9);
          pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    ::std::__cxx11::string::insert((ulong)&vector_type,psVar10);
          CompilerGLSL::to_extract_component_expression_abi_cxx11_
                    (&unpacked_expr,&this->super_CompilerGLSL,rhs_expression,
                     (uint)local_2f0._M_dataplus._M_p);
          in_R9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x31e8c7;
          CompilerGLSL::
          statement<char_const(&)[10],std::__cxx11::string,char_const(&)[4],std::__cxx11::string&,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                    (&this->super_CompilerGLSL,(char (*) [10])"((device ",&cast_expr,
                     (char (*) [4])"*)&",pbVar11,(char (*) [4])0x31e8c7,&unpacked_expr,
                     (char (*) [2])0x304bae);
          ::std::__cxx11::string::~string((string *)&unpacked_expr);
          ::std::__cxx11::string::~string((string *)&rhs_row);
          ::std::__cxx11::string::~string((string *)&cast_expr);
        }
        ::std::__cxx11::string::~string((string *)&vector_type);
      }
      local_370->need_transpose = true;
      SPIRType::~SPIRType(&write_type);
    }
  }
  else {
    bVar1 = Compiler::is_matrix((Compiler *)this,pSVar6);
    if ((local_370 == (SPIRExpression *)0x0) || (!bVar1)) {
      if (local_370 == (SPIRExpression *)0x0) goto LAB_00296de0;
      bVar3 = local_370->need_transpose;
    }
    else {
      bVar3 = local_370->need_transpose;
      if ((bool)bVar3 == true) {
        if (pSVar8 == (SPIRExpression *)0x0) {
          this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&write_type,
                     "Need to transpose right-side expression of a store to row-major matrix, but it is not a SPIRExpression."
                     ,(allocator *)&vector_type);
          CompilerError::CompilerError(this_00,(string *)&write_type);
          __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        local_370->need_transpose = false;
        if (pSVar8->need_transpose == true) {
          pSVar8->need_transpose = false;
          CompilerGLSL::to_expression_abi_cxx11_
                    ((string *)&write_type,&this->super_CompilerGLSL,lhs_expression,true);
          CompilerGLSL::to_unpacked_row_major_matrix_expression_abi_cxx11_
                    ((string *)&vector_type,&this->super_CompilerGLSL,rhs_expression);
          CompilerGLSL::
          statement<std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                    (&this->super_CompilerGLSL,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &write_type,(char (*) [4])0x31e8c7,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &vector_type,(char (*) [2])0x304bae);
          ::std::__cxx11::string::~string((string *)&vector_type);
          ::std::__cxx11::string::~string((string *)&write_type);
          pSVar8->need_transpose = true;
        }
        else {
          CompilerGLSL::to_expression_abi_cxx11_
                    ((string *)&write_type,&this->super_CompilerGLSL,lhs_expression,true);
          CompilerGLSL::to_unpacked_expression_abi_cxx11_
                    ((string *)&vector_type,&this->super_CompilerGLSL,rhs_expression,true);
          CompilerGLSL::
          statement<std::__cxx11::string,char_const(&)[14],std::__cxx11::string,char_const(&)[3]>
                    (&this->super_CompilerGLSL,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &write_type,(char (*) [14])" = transpose(",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &vector_type,(char (*) [3])0x304bad);
          ::std::__cxx11::string::~string((string *)&vector_type);
          ::std::__cxx11::string::~string((string *)&write_type);
        }
        local_370->need_transpose = true;
        goto LAB_00297709;
      }
    }
    if ((bVar3 & 1) == 0) {
LAB_00296de0:
      CompilerGLSL::emit_store_statement(&this->super_CompilerGLSL,lhs_expression,rhs_expression);
      return;
    }
    local_370->need_transpose = false;
    for (rhs_row._M_dataplus._M_p._0_4_ = 0; (uint)rhs_row._M_dataplus._M_p < pSVar6->vecsize;
        rhs_row._M_dataplus._M_p._0_4_ = (uint)rhs_row._M_dataplus._M_p + 1) {
      CompilerGLSL::to_dereferenced_expression_abi_cxx11_
                ((string *)&write_type,&this->super_CompilerGLSL,lhs_expression,true);
      psVar10 = (string *)::std::__cxx11::string::rfind((char)&write_type,0x5b);
      if (psVar10 != (string *)0xffffffffffffffff) {
        unpacked_expr._M_dataplus._M_p._0_1_ = 0x5b;
        local_2f0._M_dataplus._M_p._0_4_ = CONCAT31(local_2f0._M_dataplus._M_p._1_3_,0x5d);
        join<char,unsigned_int&,char>
                  ((string *)&vector_type,(spirv_cross *)&unpacked_expr,(char *)&rhs_row,
                   (uint *)&local_2f0,in_R8);
        pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ::std::__cxx11::string::insert((ulong)&write_type,psVar10);
        CompilerGLSL::to_extract_component_expression_abi_cxx11_
                  (&cast_expr,&this->super_CompilerGLSL,rhs_expression,
                   (uint)rhs_row._M_dataplus._M_p);
        in_R8 = ";";
        CompilerGLSL::
        statement<std::__cxx11::string&,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                  (&this->super_CompilerGLSL,pbVar11,(char (*) [4])0x31e8c7,&cast_expr,
                   (char (*) [2])0x304bae);
        ::std::__cxx11::string::~string((string *)&cast_expr);
        ::std::__cxx11::string::~string((string *)&vector_type);
      }
      ::std::__cxx11::string::~string((string *)&write_type);
    }
    local_370->need_transpose = true;
  }
LAB_00297709:
  Compiler::register_write((Compiler *)this,lhs_expression);
  return;
}

Assistant:

void CompilerMSL::emit_store_statement(uint32_t lhs_expression, uint32_t rhs_expression)
{
	auto &type = expression_type(rhs_expression);

	bool lhs_remapped_type = has_extended_decoration(lhs_expression, SPIRVCrossDecorationPhysicalTypeID);
	bool lhs_packed_type = has_extended_decoration(lhs_expression, SPIRVCrossDecorationPhysicalTypePacked);
	auto *lhs_e = maybe_get<SPIRExpression>(lhs_expression);
	auto *rhs_e = maybe_get<SPIRExpression>(rhs_expression);

	bool transpose = lhs_e && lhs_e->need_transpose;

	// No physical type remapping, and no packed type, so can just emit a store directly.
	if (!lhs_remapped_type && !lhs_packed_type)
	{
		// We might not be dealing with remapped physical types or packed types,
		// but we might be doing a clean store to a row-major matrix.
		// In this case, we just flip transpose states, and emit the store, a transpose must be in the RHS expression, if any.
		if (is_matrix(type) && lhs_e && lhs_e->need_transpose)
		{
			if (!rhs_e)
				SPIRV_CROSS_THROW("Need to transpose right-side expression of a store to row-major matrix, but it is "
				                  "not a SPIRExpression.");
			lhs_e->need_transpose = false;

			if (rhs_e && rhs_e->need_transpose)
			{
				// Direct copy, but might need to unpack RHS.
				// Skip the transpose, as we will transpose when writing to LHS and transpose(transpose(T)) == T.
				rhs_e->need_transpose = false;
				statement(to_expression(lhs_expression), " = ", to_unpacked_row_major_matrix_expression(rhs_expression),
				          ";");
				rhs_e->need_transpose = true;
			}
			else
				statement(to_expression(lhs_expression), " = transpose(", to_unpacked_expression(rhs_expression), ");");

			lhs_e->need_transpose = true;
			register_write(lhs_expression);
		}
		else if (lhs_e && lhs_e->need_transpose)
		{
			lhs_e->need_transpose = false;

			// Storing a column to a row-major matrix. Unroll the write.
			for (uint32_t c = 0; c < type.vecsize; c++)
			{
				auto lhs_expr = to_dereferenced_expression(lhs_expression);
				auto column_index = lhs_expr.find_last_of('[');
				if (column_index != string::npos)
				{
					statement(lhs_expr.insert(column_index, join('[', c, ']')), " = ",
					          to_extract_component_expression(rhs_expression, c), ";");
				}
			}
			lhs_e->need_transpose = true;
			register_write(lhs_expression);
		}
		else
			CompilerGLSL::emit_store_statement(lhs_expression, rhs_expression);
	}
	else if (!lhs_remapped_type && !is_matrix(type) && !transpose)
	{
		// Even if the target type is packed, we can directly store to it. We cannot store to packed matrices directly,
		// since they are declared as array of vectors instead, and we need the fallback path below.
		CompilerGLSL::emit_store_statement(lhs_expression, rhs_expression);
	}
	else
	{
		// Special handling when storing to a remapped physical type.
		// This is mostly to deal with std140 padded matrices or vectors.

		TypeID physical_type_id = lhs_remapped_type ?
		                              ID(get_extended_decoration(lhs_expression, SPIRVCrossDecorationPhysicalTypeID)) :
		                              type.self;

		auto &physical_type = get<SPIRType>(physical_type_id);

		if (is_matrix(type))
		{
			const char *packed_pfx = lhs_packed_type ? "packed_" : "";

			// Packed matrices are stored as arrays of packed vectors, so we need
			// to assign the vectors one at a time.
			// For row-major matrices, we need to transpose the *right-hand* side,
			// not the left-hand side.

			// Lots of cases to cover here ...

			bool rhs_transpose = rhs_e && rhs_e->need_transpose;
			SPIRType write_type = type;
			string cast_expr;

			// We're dealing with transpose manually.
			if (rhs_transpose)
				rhs_e->need_transpose = false;

			if (transpose)
			{
				// We're dealing with transpose manually.
				lhs_e->need_transpose = false;
				write_type.vecsize = type.columns;
				write_type.columns = 1;

				if (physical_type.columns != type.columns)
					cast_expr = join("(device ", packed_pfx, type_to_glsl(write_type), "&)");

				if (rhs_transpose)
				{
					// If RHS is also transposed, we can just copy row by row.
					for (uint32_t i = 0; i < type.vecsize; i++)
					{
						statement(cast_expr, to_enclosed_expression(lhs_expression), "[", i, "]", " = ",
						          to_unpacked_row_major_matrix_expression(rhs_expression), "[", i, "];");
					}
				}
				else
				{
					auto vector_type = expression_type(rhs_expression);
					vector_type.vecsize = vector_type.columns;
					vector_type.columns = 1;

					// Transpose on the fly. Emitting a lot of full transpose() ops and extracting lanes seems very bad,
					// so pick out individual components instead.
					for (uint32_t i = 0; i < type.vecsize; i++)
					{
						string rhs_row = type_to_glsl_constructor(vector_type) + "(";
						for (uint32_t j = 0; j < vector_type.vecsize; j++)
						{
							rhs_row += join(to_enclosed_unpacked_expression(rhs_expression), "[", j, "][", i, "]");
							if (j + 1 < vector_type.vecsize)
								rhs_row += ", ";
						}
						rhs_row += ")";

						statement(cast_expr, to_enclosed_expression(lhs_expression), "[", i, "]", " = ", rhs_row, ";");
					}
				}

				// We're dealing with transpose manually.
				lhs_e->need_transpose = true;
			}
			else
			{
				write_type.columns = 1;

				if (physical_type.vecsize != type.vecsize)
					cast_expr = join("(device ", packed_pfx, type_to_glsl(write_type), "&)");

				if (rhs_transpose)
				{
					auto vector_type = expression_type(rhs_expression);
					vector_type.columns = 1;

					// Transpose on the fly. Emitting a lot of full transpose() ops and extracting lanes seems very bad,
					// so pick out individual components instead.
					for (uint32_t i = 0; i < type.columns; i++)
					{
						string rhs_row = type_to_glsl_constructor(vector_type) + "(";
						for (uint32_t j = 0; j < vector_type.vecsize; j++)
						{
							// Need to explicitly unpack expression since we've mucked with transpose state.
							auto unpacked_expr = to_unpacked_row_major_matrix_expression(rhs_expression);
							rhs_row += join(unpacked_expr, "[", j, "][", i, "]");
							if (j + 1 < vector_type.vecsize)
								rhs_row += ", ";
						}
						rhs_row += ")";

						statement(cast_expr, to_enclosed_expression(lhs_expression), "[", i, "]", " = ", rhs_row, ";");
					}
				}
				else
				{
					// Copy column-by-column.
					for (uint32_t i = 0; i < type.columns; i++)
					{
						statement(cast_expr, to_enclosed_expression(lhs_expression), "[", i, "]", " = ",
						          to_enclosed_unpacked_expression(rhs_expression), "[", i, "];");
					}
				}
			}

			// We're dealing with transpose manually.
			if (rhs_transpose)
				rhs_e->need_transpose = true;
		}
		else if (transpose)
		{
			lhs_e->need_transpose = false;

			SPIRType write_type = type;
			write_type.vecsize = 1;
			write_type.columns = 1;

			// Storing a column to a row-major matrix. Unroll the write.
			for (uint32_t c = 0; c < type.vecsize; c++)
			{
				auto lhs_expr = to_enclosed_expression(lhs_expression);
				auto column_index = lhs_expr.find_last_of('[');
				if (column_index != string::npos)
				{
					statement("((device ", type_to_glsl(write_type), "*)&",
					          lhs_expr.insert(column_index, join('[', c, ']', ")")), " = ",
					          to_extract_component_expression(rhs_expression, c), ";");
				}
			}

			lhs_e->need_transpose = true;
		}
		else if ((is_matrix(physical_type) || is_array(physical_type)) && physical_type.vecsize > type.vecsize)
		{
			assert(type.vecsize >= 1 && type.vecsize <= 3);

			// If we have packed types, we cannot use swizzled stores.
			// We could technically unroll the store for each element if needed.
			// When remapping to a std140 physical type, we always get float4,
			// and the packed decoration should always be removed.
			assert(!lhs_packed_type);

			string lhs = to_dereferenced_expression(lhs_expression);
			string rhs = to_pointer_expression(rhs_expression);

			// Unpack the expression so we can store to it with a float or float2.
			// It's still an l-value, so it's fine. Most other unpacking of expressions turn them into r-values instead.
			lhs = join("(device ", type_to_glsl(type), "&)", enclose_expression(lhs));
			if (!optimize_read_modify_write(expression_type(rhs_expression), lhs, rhs))
				statement(lhs, " = ", rhs, ";");
		}
		else if (!is_matrix(type))
		{
			string lhs = to_dereferenced_expression(lhs_expression);
			string rhs = to_pointer_expression(rhs_expression);
			if (!optimize_read_modify_write(expression_type(rhs_expression), lhs, rhs))
				statement(lhs, " = ", rhs, ";");
		}

		register_write(lhs_expression);
	}
}